

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<long_long>::emplace<long_long&>
          (QPodArrayOps<long_long> *this,qsizetype i,longlong *args)

{
  undefined1 uVar1;
  qsizetype qVar2;
  longlong *plVar3;
  longlong *in_RDX;
  long in_RSI;
  QArrayDataPointer<long_long> *in_RDI;
  longlong *where;
  GrowthPosition pos;
  longlong tmp;
  bool detach;
  QArrayDataPointer<long_long> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  longlong lVar5;
  undefined7 in_stack_ffffffffffffffe0;
  
  uVar1 = QArrayDataPointer<long_long>::needsDetach(in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->size) &&
       (qVar2 = QArrayDataPointer<long_long>::freeSpaceAtEnd(in_stack_ffffffffffffffc8), qVar2 != 0)
       ) {
      plVar3 = QArrayDataPointer<long_long>::end(in_RDI);
      *plVar3 = *in_RDX;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
    if ((in_RSI == 0) &&
       (qVar2 = QArrayDataPointer<long_long>::freeSpaceAtBegin(in_stack_ffffffffffffffc8),
       qVar2 != 0)) {
      plVar3 = QArrayDataPointer<long_long>::begin((QArrayDataPointer<long_long> *)0x8839c7);
      plVar3[-1] = *in_RDX;
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
  }
  lVar5 = *in_RDX;
  uVar4 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar4 = 1;
  }
  QArrayDataPointer<long_long>::detachAndGrow
            ((QArrayDataPointer<long_long> *)CONCAT17(uVar1,in_stack_ffffffffffffffe0),
             (GrowthPosition)((ulong)lVar5 >> 0x20),CONCAT44(uVar4,in_stack_ffffffffffffffd0),
             (longlong **)in_stack_ffffffffffffffc8,in_RDI);
  plVar3 = createHole((QPodArrayOps<long_long> *)CONCAT17(uVar1,in_stack_ffffffffffffffe0),
                      (GrowthPosition)((ulong)lVar5 >> 0x20),
                      CONCAT44(uVar4,in_stack_ffffffffffffffd0),(qsizetype)in_stack_ffffffffffffffc8
                     );
  *plVar3 = lVar5;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }